

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  __m128i *palVar4;
  uint uVar5;
  longlong lVar6;
  longlong lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  longlong lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i alVar22;
  short sVar23;
  short sVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *palVar28;
  int iVar29;
  ushort uVar30;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar31 [16];
  ushort uVar40;
  undefined1 auVar32 [16];
  ulong uVar37;
  ulong local_730;
  int local_724;
  int local_714;
  long local_710;
  long local_708;
  int local_6fc;
  ulong uStack_6e8;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m128i vCompare;
  int16_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_5be;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2e8;
  short sStack_2e6;
  short sStack_2e4;
  short sStack_2e2;
  short sStack_2e0;
  short sStack_2de;
  short sStack_2dc;
  short sStack_2da;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar25 = (iVar1 + 7) / 8;
    iVar29 = (iVar1 + -1) % iVar25;
    iVar26 = ~((iVar1 + -1) / iVar25) + 8;
    pvVar3 = (profile->profile16).score;
    s1_beg_local._0_2_ = (short)open;
    uVar8 = CONCAT26((short)s1_beg_local,
                     CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local))
                    );
    uVar9 = CONCAT26((short)s1_beg_local,
                     CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local))
                    );
    i._0_2_ = (undefined2)gap;
    uVar10 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    uVar11 = CONCAT26((undefined2)i,CONCAT24((undefined2)i,CONCAT22((undefined2)i,(undefined2)i)));
    if (ppVar2->min <= -open) {
      s1_beg_local._0_2_ = -(short)ppVar2->min;
    }
    sVar23 = (short)s1_beg_local + -0x7fff;
    sVar24 = ((ushort)ppVar2->max ^ 0x7fff) - 1;
    lVar12 = CONCAT26(sVar23,CONCAT24(sVar23,CONCAT22(sVar23,sVar23)));
    lVar13 = CONCAT26(sVar23,CONCAT24(sVar23,CONCAT22(sVar23,sVar23)));
    vSaturationCheckMax[1] = CONCAT26(sVar24,CONCAT24(sVar24,CONCAT22(sVar24,sVar24)));
    vSaturationCheckMin[0] = CONCAT26(sVar24,CONCAT24(sVar24,CONCAT22(sVar24,sVar24)));
    vProfile._0_2_ = (short)iVar26;
    result._0_2_ = -(ushort)((short)vProfile == 7);
    result._2_2_ = -(ushort)((short)vProfile == 6);
    result._4_2_ = -(ushort)((short)vProfile == 5);
    result._6_2_ = -(ushort)((short)vProfile == 4);
    vPosMask[0]._0_2_ = -(ushort)((short)vProfile == 3);
    vPosMask[0]._2_2_ = -(ushort)((short)vProfile == 2);
    vPosMask[0]._4_2_ = -(ushort)((short)vProfile == 1);
    vPosMask[0]._6_2_ = -(ushort)((short)vProfile == 0);
    vPosMask[1] = lVar12;
    _segNum = (parasail_profile_t *)parasail_result_new();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8200802;
      uVar5 = 0;
      if (s1_beg != 0) {
        uVar5 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s1_end != 0) {
        uVar5 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s2_beg != 0) {
        uVar5 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s2_end != 0) {
        uVar5 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar25);
      pvE = parasail_memalign___m128i(0x10,(long)iVar25);
      ptr = parasail_memalign___m128i(0x10,(long)iVar25);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar25; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              local_6fc = -(gap * (h.m[1]._0_4_ * iVar25 + k)) - open;
            }
            else {
              local_6fc = 0;
            }
            local_710 = (long)local_6fc;
            local_708 = local_710;
            if (local_710 < -0x8000) {
              local_708 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_708;
            local_710 = local_710 - open;
            if (local_710 < -0x8000) {
              local_710 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_710;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_714 = -(gap * (k + -1)) - open;
          }
          else {
            local_714 = 0;
          }
          if (local_714 < -0x8000) {
            local_714 = -0x8000;
          }
          ptr_00[k] = (int16_t)local_714;
        }
        vMaxH[0] = lVar13;
        vMaxH[1] = lVar12;
        vSaturationCheckMax[0] = lVar13;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          vF[0] = lVar13;
          vH[1] = lVar12;
          uVar37 = pvHLoad[iVar25 + -1][0];
          iVar27 = ppVar2->mapper[(byte)s2[s1Len]];
          palVar4 = pvE;
          vH[0] = pvHLoad[iVar25 + -1][1] << 0x10 | uVar37 >> 0x30;
          vP = (__m128i *)(uVar37 << 0x10 | (ulong)(ushort)ptr_00[s1Len]);
          for (k = 0; k < iVar25; k = k + 1) {
            auVar31 = paddsw((undefined1  [16])_vP,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar27 * iVar25) * 0x10));
            palVar28 = ptr + k;
            lVar6 = (*palVar28)[0];
            lVar7 = (*palVar28)[1];
            alVar22 = *palVar28;
            local_248 = auVar31._0_2_;
            sStack_246 = auVar31._2_2_;
            sStack_244 = auVar31._4_2_;
            sStack_242 = auVar31._6_2_;
            sStack_240 = auVar31._8_2_;
            sStack_23e = auVar31._10_2_;
            sStack_23c = auVar31._12_2_;
            sStack_23a = auVar31._14_2_;
            local_258 = (short)lVar6;
            sStack_256 = (short)((ulong)lVar6 >> 0x10);
            sStack_254 = (short)((ulong)lVar6 >> 0x20);
            sStack_252 = (short)((ulong)lVar6 >> 0x30);
            sStack_250 = (short)lVar7;
            sStack_24e = (short)((ulong)lVar7 >> 0x10);
            sStack_24c = (short)((ulong)lVar7 >> 0x20);
            sStack_24a = (short)((ulong)lVar7 >> 0x30);
            uVar30 = (ushort)(local_248 < local_258) * local_258 |
                     (ushort)(local_248 >= local_258) * local_248;
            uVar33 = (ushort)(sStack_246 < sStack_256) * sStack_256 |
                     (ushort)(sStack_246 >= sStack_256) * sStack_246;
            uVar34 = (ushort)(sStack_244 < sStack_254) * sStack_254 |
                     (ushort)(sStack_244 >= sStack_254) * sStack_244;
            uVar35 = (ushort)(sStack_242 < sStack_252) * sStack_252 |
                     (ushort)(sStack_242 >= sStack_252) * sStack_242;
            uVar36 = (ushort)(sStack_240 < sStack_250) * sStack_250 |
                     (ushort)(sStack_240 >= sStack_250) * sStack_240;
            uVar38 = (ushort)(sStack_23e < sStack_24e) * sStack_24e |
                     (ushort)(sStack_23e >= sStack_24e) * sStack_23e;
            uVar39 = (ushort)(sStack_23c < sStack_24c) * sStack_24c |
                     (ushort)(sStack_23c >= sStack_24c) * sStack_23c;
            uVar40 = (ushort)(sStack_23a < sStack_24a) * sStack_24a |
                     (ushort)(sStack_23a >= sStack_24a) * sStack_23a;
            local_278 = (short)vH[1];
            sStack_276 = vH[1]._2_2_;
            sStack_274 = vH[1]._4_2_;
            sStack_272 = vH[1]._6_2_;
            sStack_270 = (short)vH[2];
            sStack_26e = vH[2]._2_2_;
            sStack_26c = vH[2]._4_2_;
            sStack_26a = vH[2]._6_2_;
            uVar30 = (ushort)((short)uVar30 < local_278) * local_278 |
                     ((short)uVar30 >= local_278) * uVar30;
            uVar33 = (ushort)((short)uVar33 < sStack_276) * sStack_276 |
                     ((short)uVar33 >= sStack_276) * uVar33;
            uVar34 = (ushort)((short)uVar34 < sStack_274) * sStack_274 |
                     ((short)uVar34 >= sStack_274) * uVar34;
            uVar35 = (ushort)((short)uVar35 < sStack_272) * sStack_272 |
                     ((short)uVar35 >= sStack_272) * uVar35;
            uVar36 = (ushort)((short)uVar36 < sStack_270) * sStack_270 |
                     ((short)uVar36 >= sStack_270) * uVar36;
            uVar38 = (ushort)((short)uVar38 < sStack_26e) * sStack_26e |
                     ((short)uVar38 >= sStack_26e) * uVar38;
            uVar39 = (ushort)((short)uVar39 < sStack_26c) * sStack_26c |
                     ((short)uVar39 >= sStack_26c) * uVar39;
            uVar40 = (ushort)((short)uVar40 < sStack_26a) * sStack_26a |
                     ((short)uVar40 >= sStack_26a) * uVar40;
            vP._0_4_ = CONCAT22(uVar33,uVar30);
            vP._0_6_ = CONCAT24(uVar34,vP._0_4_);
            vP = (__m128i *)CONCAT26(uVar35,vP._0_6_);
            vH[0]._0_2_ = uVar36;
            vH[0]._2_2_ = uVar38;
            vH[0]._4_2_ = uVar39;
            vH[0]._6_2_ = uVar40;
            pvE[k][0] = (longlong)vP;
            pvE[k][1] = vH[0];
            local_288 = (short)vMaxH[1];
            sStack_286 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_284 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_282 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_280 = (short)vSaturationCheckMax[0];
            sStack_27e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_27c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_27a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            vMaxH[1]._0_4_ =
                 CONCAT22((sStack_286 < (short)uVar33) * uVar33 |
                          (ushort)(sStack_286 >= (short)uVar33) * sStack_286,
                          (local_288 < (short)uVar30) * uVar30 |
                          (ushort)(local_288 >= (short)uVar30) * local_288);
            vMaxH[1]._0_6_ =
                 CONCAT24((sStack_284 < (short)uVar34) * uVar34 |
                          (ushort)(sStack_284 >= (short)uVar34) * sStack_284,(undefined4)vMaxH[1]);
            vMaxH[1] = CONCAT26((sStack_282 < (short)uVar35) * uVar35 |
                                (ushort)(sStack_282 >= (short)uVar35) * sStack_282,
                                (undefined6)vMaxH[1]);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((sStack_27e < (short)uVar38) * uVar38 |
                          (ushort)(sStack_27e >= (short)uVar38) * sStack_27e,
                          (sStack_280 < (short)uVar36) * uVar36 |
                          (ushort)(sStack_280 >= (short)uVar36) * sStack_280);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((sStack_27c < (short)uVar39) * uVar39 |
                          (ushort)(sStack_27c >= (short)uVar39) * sStack_27c,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_27a < (short)uVar40) * uVar40 |
                          (ushort)(sStack_27a >= (short)uVar40) * sStack_27a,
                          (undefined6)vSaturationCheckMax[0]);
            local_1c8 = (short)vSaturationCheckMax[1];
            sStack_1c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_1c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_1c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_1c0 = (short)vSaturationCheckMin[0];
            sStack_1be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_1bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_1ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            uVar30 = ((short)uVar30 < local_1c8) * uVar30 |
                     (ushort)((short)uVar30 >= local_1c8) * local_1c8;
            uVar33 = ((short)uVar33 < sStack_1c6) * uVar33 |
                     (ushort)((short)uVar33 >= sStack_1c6) * sStack_1c6;
            uVar34 = ((short)uVar34 < sStack_1c4) * uVar34 |
                     (ushort)((short)uVar34 >= sStack_1c4) * sStack_1c4;
            uVar35 = ((short)uVar35 < sStack_1c2) * uVar35 |
                     (ushort)((short)uVar35 >= sStack_1c2) * sStack_1c2;
            uVar36 = ((short)uVar36 < sStack_1c0) * uVar36 |
                     (ushort)((short)uVar36 >= sStack_1c0) * sStack_1c0;
            uVar38 = ((short)uVar38 < sStack_1be) * uVar38 |
                     (ushort)((short)uVar38 >= sStack_1be) * sStack_1be;
            uVar39 = ((short)uVar39 < sStack_1bc) * uVar39 |
                     (ushort)((short)uVar39 >= sStack_1bc) * sStack_1bc;
            uVar40 = ((short)uVar40 < sStack_1ba) * uVar40 |
                     (ushort)((short)uVar40 >= sStack_1ba) * sStack_1ba;
            uVar30 = (ushort)(local_258 < (short)uVar30) * local_258 |
                     (local_258 >= (short)uVar30) * uVar30;
            uVar33 = (ushort)(sStack_256 < (short)uVar33) * sStack_256 |
                     (sStack_256 >= (short)uVar33) * uVar33;
            uVar34 = (ushort)(sStack_254 < (short)uVar34) * sStack_254 |
                     (sStack_254 >= (short)uVar34) * uVar34;
            uVar35 = (ushort)(sStack_252 < (short)uVar35) * sStack_252 |
                     (sStack_252 >= (short)uVar35) * uVar35;
            uVar36 = (ushort)(sStack_250 < (short)uVar36) * sStack_250 |
                     (sStack_250 >= (short)uVar36) * uVar36;
            uVar38 = (ushort)(sStack_24e < (short)uVar38) * sStack_24e |
                     (sStack_24e >= (short)uVar38) * uVar38;
            uVar39 = (ushort)(sStack_24c < (short)uVar39) * sStack_24c |
                     (sStack_24c >= (short)uVar39) * uVar39;
            uVar40 = (ushort)(sStack_24a < (short)uVar40) * sStack_24a |
                     (sStack_24a >= (short)uVar40) * uVar40;
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22((ushort)(sStack_276 < (short)uVar33) * sStack_276 |
                          (sStack_276 >= (short)uVar33) * uVar33,
                          (ushort)(local_278 < (short)uVar30) * local_278 |
                          (local_278 >= (short)uVar30) * uVar30);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24((ushort)(sStack_274 < (short)uVar34) * sStack_274 |
                          (sStack_274 >= (short)uVar34) * uVar34,(undefined4)vSaturationCheckMax[1])
            ;
            vSaturationCheckMax[1] =
                 CONCAT26((ushort)(sStack_272 < (short)uVar35) * sStack_272 |
                          (sStack_272 >= (short)uVar35) * uVar35,(undefined6)vSaturationCheckMax[1])
            ;
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22((ushort)(sStack_26e < (short)uVar38) * sStack_26e |
                          (sStack_26e >= (short)uVar38) * uVar38,
                          (ushort)(sStack_270 < (short)uVar36) * sStack_270 |
                          (sStack_270 >= (short)uVar36) * uVar36);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24((ushort)(sStack_26c < (short)uVar39) * sStack_26c |
                          (sStack_26c >= (short)uVar39) * uVar39,(undefined4)vSaturationCheckMin[0])
            ;
            vSaturationCheckMin[0] =
                 CONCAT26((ushort)(sStack_26a < (short)uVar40) * sStack_26a |
                          (sStack_26a >= (short)uVar40) * uVar40,(undefined6)vSaturationCheckMin[0])
            ;
            auVar18._8_8_ = vH[0];
            auVar18._0_8_ = vP;
            auVar17._8_8_ = uVar9;
            auVar17._0_8_ = uVar8;
            auVar31 = psubsw(auVar18,auVar17);
            auVar32._8_8_ = uVar11;
            auVar32._0_8_ = uVar10;
            auVar32 = psubsw((undefined1  [16])alVar22,auVar32);
            local_2a8 = auVar32._0_2_;
            sStack_2a6 = auVar32._2_2_;
            sStack_2a4 = auVar32._4_2_;
            sStack_2a2 = auVar32._6_2_;
            sStack_2a0 = auVar32._8_2_;
            sStack_29e = auVar32._10_2_;
            sStack_29c = auVar32._12_2_;
            sStack_29a = auVar32._14_2_;
            local_2b8 = auVar31._0_2_;
            sStack_2b6 = auVar31._2_2_;
            sStack_2b4 = auVar31._4_2_;
            sStack_2b2 = auVar31._6_2_;
            sStack_2b0 = auVar31._8_2_;
            sStack_2ae = auVar31._10_2_;
            sStack_2ac = auVar31._12_2_;
            sStack_2aa = auVar31._14_2_;
            vF[1] = CONCAT26((ushort)(sStack_2a2 < sStack_2b2) * sStack_2b2 |
                             (ushort)(sStack_2a2 >= sStack_2b2) * sStack_2a2,
                             CONCAT24((ushort)(sStack_2a4 < sStack_2b4) * sStack_2b4 |
                                      (ushort)(sStack_2a4 >= sStack_2b4) * sStack_2a4,
                                      CONCAT22((ushort)(sStack_2a6 < sStack_2b6) * sStack_2b6 |
                                               (ushort)(sStack_2a6 >= sStack_2b6) * sStack_2a6,
                                               (ushort)(local_2a8 < local_2b8) * local_2b8 |
                                               (ushort)(local_2a8 >= local_2b8) * local_2a8)));
            vE[0]._0_2_ = (ushort)(sStack_2a0 < sStack_2b0) * sStack_2b0 |
                          (ushort)(sStack_2a0 >= sStack_2b0) * sStack_2a0;
            vE[0]._2_2_ = (ushort)(sStack_29e < sStack_2ae) * sStack_2ae |
                          (ushort)(sStack_29e >= sStack_2ae) * sStack_29e;
            vE[0]._4_2_ = (ushort)(sStack_29c < sStack_2ac) * sStack_2ac |
                          (ushort)(sStack_29c >= sStack_2ac) * sStack_29c;
            vE[0]._6_2_ = (ushort)(sStack_29a < sStack_2aa) * sStack_2aa |
                          (ushort)(sStack_29a >= sStack_2aa) * sStack_29a;
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            auVar31._8_8_ = uVar11;
            auVar31._0_8_ = uVar10;
            auVar31 = psubsw(stack0xfffffffffffff978,auVar31);
            local_2c8 = auVar31._0_2_;
            sStack_2c6 = auVar31._2_2_;
            sStack_2c4 = auVar31._4_2_;
            sStack_2c2 = auVar31._6_2_;
            sStack_2c0 = auVar31._8_2_;
            sStack_2be = auVar31._10_2_;
            sStack_2bc = auVar31._12_2_;
            sStack_2ba = auVar31._14_2_;
            vH[1] = CONCAT26((ushort)(sStack_2c2 < sStack_2b2) * sStack_2b2 |
                             (ushort)(sStack_2c2 >= sStack_2b2) * sStack_2c2,
                             CONCAT24((ushort)(sStack_2c4 < sStack_2b4) * sStack_2b4 |
                                      (ushort)(sStack_2c4 >= sStack_2b4) * sStack_2c4,
                                      CONCAT22((ushort)(sStack_2c6 < sStack_2b6) * sStack_2b6 |
                                               (ushort)(sStack_2c6 >= sStack_2b6) * sStack_2c6,
                                               (ushort)(local_2c8 < local_2b8) * local_2b8 |
                                               (ushort)(local_2c8 >= local_2b8) * local_2c8)));
            vF[0]._0_2_ = (ushort)(sStack_2c0 < sStack_2b0) * sStack_2b0 |
                          (ushort)(sStack_2c0 >= sStack_2b0) * sStack_2c0;
            vF[0]._2_2_ = (ushort)(sStack_2be < sStack_2ae) * sStack_2ae |
                          (ushort)(sStack_2be >= sStack_2ae) * sStack_2be;
            vF[0]._4_2_ = (ushort)(sStack_2bc < sStack_2ac) * sStack_2ac |
                          (ushort)(sStack_2bc >= sStack_2ac) * sStack_2bc;
            vF[0]._6_2_ = (ushort)(sStack_2ba < sStack_2aa) * sStack_2aa |
                          (ushort)(sStack_2ba >= sStack_2aa) * sStack_2ba;
            _vP = pvHLoad[k];
          }
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            if (s2_beg == 0) {
              local_724 = ptr_00[s1Len + 1] - open;
            }
            else {
              local_724 = -open;
            }
            local_730 = (ulong)local_724;
            if ((long)local_730 < -0x8000) {
              local_730 = 0xffffffffffff8000;
            }
            vF[0] = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
            vH[1] = vH[1] << 0x10 | local_730 & 0xffff;
            for (k = 0; k < iVar25; k = k + 1) {
              lVar6 = pvE[k][0];
              lVar7 = pvE[k][1];
              local_2e8 = (short)lVar6;
              sStack_2e6 = (short)((ulong)lVar6 >> 0x10);
              sStack_2e4 = (short)((ulong)lVar6 >> 0x20);
              sStack_2e2 = (short)((ulong)lVar6 >> 0x30);
              sStack_2e0 = (short)lVar7;
              sStack_2de = (short)((ulong)lVar7 >> 0x10);
              sStack_2dc = (short)((ulong)lVar7 >> 0x20);
              sStack_2da = (short)((ulong)lVar7 >> 0x30);
              local_2f8 = (short)vH[1];
              sStack_2f6 = vH[1]._2_2_;
              sStack_2f4 = vH[1]._4_2_;
              sStack_2f2 = vH[1]._6_2_;
              sStack_2f0 = (short)vH[2];
              sStack_2ee = vH[2]._2_2_;
              sStack_2ec = vH[2]._4_2_;
              sStack_2ea = vH[2]._6_2_;
              uVar30 = (ushort)(local_2e8 < local_2f8) * local_2f8 |
                       (ushort)(local_2e8 >= local_2f8) * local_2e8;
              uVar33 = (ushort)(sStack_2e6 < sStack_2f6) * sStack_2f6 |
                       (ushort)(sStack_2e6 >= sStack_2f6) * sStack_2e6;
              uVar34 = (ushort)(sStack_2e4 < sStack_2f4) * sStack_2f4 |
                       (ushort)(sStack_2e4 >= sStack_2f4) * sStack_2e4;
              uVar35 = (ushort)(sStack_2e2 < sStack_2f2) * sStack_2f2 |
                       (ushort)(sStack_2e2 >= sStack_2f2) * sStack_2e2;
              uVar36 = (ushort)(sStack_2e0 < sStack_2f0) * sStack_2f0 |
                       (ushort)(sStack_2e0 >= sStack_2f0) * sStack_2e0;
              uVar38 = (ushort)(sStack_2de < sStack_2ee) * sStack_2ee |
                       (ushort)(sStack_2de >= sStack_2ee) * sStack_2de;
              uVar39 = (ushort)(sStack_2dc < sStack_2ec) * sStack_2ec |
                       (ushort)(sStack_2dc >= sStack_2ec) * sStack_2dc;
              uVar40 = (ushort)(sStack_2da < sStack_2ea) * sStack_2ea |
                       (ushort)(sStack_2da >= sStack_2ea) * sStack_2da;
              vP._0_4_ = CONCAT22(uVar33,uVar30);
              vP._0_6_ = CONCAT24(uVar34,vP._0_4_);
              vP = (__m128i *)CONCAT26(uVar35,vP._0_6_);
              vH[0]._0_2_ = uVar36;
              vH[0]._2_2_ = uVar38;
              vH[0]._4_2_ = uVar39;
              vH[0]._6_2_ = uVar40;
              pvE[k][0] = (longlong)vP;
              pvE[k][1] = vH[0];
              local_228 = (short)vSaturationCheckMax[1];
              sStack_226 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_224 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_222 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_220 = (short)vSaturationCheckMin[0];
              sStack_21e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_21c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_21a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar33 < sStack_226) * uVar33 |
                            (ushort)((short)uVar33 >= sStack_226) * sStack_226,
                            ((short)uVar30 < local_228) * uVar30 |
                            (ushort)((short)uVar30 >= local_228) * local_228);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar34 < sStack_224) * uVar34 |
                            (ushort)((short)uVar34 >= sStack_224) * sStack_224,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar35 < sStack_222) * uVar35 |
                            (ushort)((short)uVar35 >= sStack_222) * sStack_222,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar38 < sStack_21e) * uVar38 |
                            (ushort)((short)uVar38 >= sStack_21e) * sStack_21e,
                            ((short)uVar36 < sStack_220) * uVar36 |
                            (ushort)((short)uVar36 >= sStack_220) * sStack_220);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar39 < sStack_21c) * uVar39 |
                            (ushort)((short)uVar39 >= sStack_21c) * sStack_21c,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar40 < sStack_21a) * uVar40 |
                            (ushort)((short)uVar40 >= sStack_21a) * sStack_21a,
                            (undefined6)vSaturationCheckMin[0]);
              local_308 = (short)vMaxH[1];
              sStack_306 = (short)((ulong)vMaxH[1] >> 0x10);
              sStack_304 = (short)((ulong)vMaxH[1] >> 0x20);
              sStack_302 = (short)((ulong)vMaxH[1] >> 0x30);
              sStack_300 = (short)vSaturationCheckMax[0];
              sStack_2fe = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_2fc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_2fa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vMaxH[1]._0_4_ =
                   CONCAT22((sStack_306 < (short)uVar33) * uVar33 |
                            (ushort)(sStack_306 >= (short)uVar33) * sStack_306,
                            (local_308 < (short)uVar30) * uVar30 |
                            (ushort)(local_308 >= (short)uVar30) * local_308);
              vMaxH[1]._0_6_ =
                   CONCAT24((sStack_304 < (short)uVar34) * uVar34 |
                            (ushort)(sStack_304 >= (short)uVar34) * sStack_304,(undefined4)vMaxH[1])
              ;
              vMaxH[1] = CONCAT26((sStack_302 < (short)uVar35) * uVar35 |
                                  (ushort)(sStack_302 >= (short)uVar35) * sStack_302,
                                  (undefined6)vMaxH[1]);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((sStack_2fe < (short)uVar38) * uVar38 |
                            (ushort)(sStack_2fe >= (short)uVar38) * sStack_2fe,
                            (sStack_300 < (short)uVar36) * uVar36 |
                            (ushort)(sStack_300 >= (short)uVar36) * sStack_300);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((sStack_2fc < (short)uVar39) * uVar39 |
                            (ushort)(sStack_2fc >= (short)uVar39) * sStack_2fc,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((sStack_2fa < (short)uVar40) * uVar40 |
                            (ushort)(sStack_2fa >= (short)uVar40) * sStack_2fa,
                            (undefined6)vSaturationCheckMax[0]);
              auVar16._8_8_ = vH[0];
              auVar16._0_8_ = vP;
              auVar15._8_8_ = uVar9;
              auVar15._0_8_ = uVar8;
              auVar31 = psubsw(auVar16,auVar15);
              auVar14._8_8_ = uVar11;
              auVar14._0_8_ = uVar10;
              register0x00001200 = psubsw(stack0xfffffffffffff978,auVar14);
              local_98 = (short)vH[1];
              sStack_96 = vH[1]._2_2_;
              sStack_94 = vH[1]._4_2_;
              sStack_92 = vH[1]._6_2_;
              sStack_90 = (short)vH[2];
              sStack_8e = vH[2]._2_2_;
              sStack_8c = vH[2]._4_2_;
              sStack_8a = vH[2]._6_2_;
              local_a8 = auVar31._0_2_;
              sStack_a6 = auVar31._2_2_;
              sStack_a4 = auVar31._4_2_;
              sStack_a2 = auVar31._6_2_;
              sStack_a0 = auVar31._8_2_;
              sStack_9e = auVar31._10_2_;
              sStack_9c = auVar31._12_2_;
              sStack_9a = auVar31._14_2_;
              uVar30 = -(ushort)(sStack_9a < sStack_8a);
              auVar21._2_2_ = -(ushort)(sStack_a6 < sStack_96);
              auVar21._0_2_ = -(ushort)(local_a8 < local_98);
              auVar21._4_2_ = -(ushort)(sStack_a4 < sStack_94);
              auVar21._6_2_ = -(ushort)(sStack_a2 < sStack_92);
              auVar21._8_2_ = -(ushort)(sStack_a0 < sStack_90);
              auVar21._10_2_ = -(ushort)(sStack_9e < sStack_8e);
              auVar21._12_2_ = -(ushort)(sStack_9c < sStack_8c);
              auVar21._14_2_ = uVar30;
              if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (uVar30 >> 7 & 1) == 0) && sStack_9a >= sStack_8a) goto LAB_005f0602;
            }
          }
LAB_005f0602:
          lVar6 = pvE[iVar29][0];
          lVar7 = pvE[iVar29][1];
          local_b8 = (short)lVar6;
          sStack_b6 = (short)((ulong)lVar6 >> 0x10);
          sStack_b4 = (short)((ulong)lVar6 >> 0x20);
          sStack_b2 = (short)((ulong)lVar6 >> 0x30);
          sStack_b0 = (short)lVar7;
          sStack_ae = (short)((ulong)lVar7 >> 0x10);
          sStack_ac = (short)((ulong)lVar7 >> 0x20);
          sStack_aa = (short)((ulong)lVar7 >> 0x30);
          local_c8 = (short)vPosMask[1];
          sStack_c6 = (short)((ulong)vPosMask[1] >> 0x10);
          sStack_c4 = (short)((ulong)vPosMask[1] >> 0x20);
          sStack_c2 = (short)((ulong)vPosMask[1] >> 0x30);
          sStack_c0 = (short)vMaxH[0];
          sStack_be = (short)((ulong)vMaxH[0] >> 0x10);
          sStack_bc = (short)((ulong)vMaxH[0] >> 0x20);
          sStack_ba = (short)((ulong)vMaxH[0] >> 0x30);
          uVar37 = CONCAT26(vPosMask[0]._6_2_,
                            CONCAT24(vPosMask[0]._4_2_,
                                     CONCAT22(vPosMask[0]._2_2_,(short)vPosMask[0]))) &
                   CONCAT26(-(ushort)(sStack_ba < sStack_aa),
                            CONCAT24(-(ushort)(sStack_bc < sStack_ac),
                                     CONCAT22(-(ushort)(sStack_be < sStack_ae),
                                              -(ushort)(sStack_c0 < sStack_b0))));
          vPosMask[1] = CONCAT26((ushort)(sStack_b2 < sStack_c2) * sStack_c2 |
                                 (ushort)(sStack_b2 >= sStack_c2) * sStack_b2,
                                 CONCAT24((ushort)(sStack_b4 < sStack_c4) * sStack_c4 |
                                          (ushort)(sStack_b4 >= sStack_c4) * sStack_b4,
                                          CONCAT22((ushort)(sStack_b6 < sStack_c6) * sStack_c6 |
                                                   (ushort)(sStack_b6 >= sStack_c6) * sStack_b6,
                                                   (ushort)(local_b8 < local_c8) * local_c8 |
                                                   (ushort)(local_b8 >= local_c8) * local_b8)));
          vMaxH[0] = CONCAT26((ushort)(sStack_aa < sStack_ba) * sStack_ba |
                              (ushort)(sStack_aa >= sStack_ba) * sStack_aa,
                              CONCAT24((ushort)(sStack_ac < sStack_bc) * sStack_bc |
                                       (ushort)(sStack_ac >= sStack_bc) * sStack_ac,
                                       CONCAT22((ushort)(sStack_ae < sStack_be) * sStack_be |
                                                (ushort)(sStack_ae >= sStack_be) * sStack_ae,
                                                (ushort)(sStack_b0 < sStack_c0) * sStack_c0 |
                                                (ushort)(sStack_b0 >= sStack_c0) * sStack_b0)));
          auVar20._8_8_ = uVar37;
          auVar20._0_8_ =
               CONCAT26(result._6_2_,CONCAT24(result._4_2_,CONCAT22(result._2_2_,(short)result))) &
               CONCAT26(-(ushort)(sStack_c2 < sStack_b2),
                        CONCAT24(-(ushort)(sStack_c4 < sStack_b4),
                                 CONCAT22(-(ushort)(sStack_c6 < sStack_b6),
                                          -(ushort)(local_c8 < local_b8))));
          if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar37 >> 7 & 1) != 0) || (uVar37 >> 0xf & 1) != 0) ||
                  (uVar37 >> 0x17 & 1) != 0) || (uVar37 >> 0x1f & 1) != 0) ||
                (uVar37 >> 0x27 & 1) != 0) || (uVar37 >> 0x2f & 1) != 0) ||
              (uVar37 >> 0x37 & 1) != 0) || (long)uVar37 < 0) {
            matrix._0_4_ = s1Len;
          }
          pvE = pvHLoad;
          pvHLoad = palVar4;
        }
        local_5be = sVar23;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar26; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 0x10 | (ulong)vPosMask[1] >> 0x30;
            vPosMask[1] = vPosMask[1] << 0x10;
          }
          local_5be = vMaxH[0]._6_2_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = pvHLoad;
          for (k = 0; k < iVar25 * 8; k = k + 1) {
            iVar27 = k / 8 + (k % 8) * iVar25;
            if (iVar27 < iVar1) {
              if (local_5be < (short)(*_temp)[0]) {
                local_5be = (short)(*_temp)[0];
                matrix._0_4_ = s2Len + -1;
                matrix._4_4_ = iVar27;
              }
              else if ((((short)(*_temp)[0] == local_5be) && ((int)matrix == s2Len + -1)) &&
                      (iVar27 < matrix._4_4_)) {
                matrix._4_4_ = iVar27;
              }
            }
            _temp = (__m128i *)((long)*_temp + 2);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = pvHLoad[iVar29][1];
          uStack_6e8 = pvHLoad[iVar29][0];
          for (end_query = 0; end_query < iVar26; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 0x10 | uStack_6e8 >> 0x30;
            uStack_6e8 = uStack_6e8 << 0x10;
          }
          local_5be = vH_1[0]._6_2_;
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
        }
        local_28 = (short)vSaturationCheckMax[1];
        sStack_26 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_24 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_22 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMin[0];
        sStack_1e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_d8 = (short)vMaxH[1];
        sStack_d6 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_d4 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_d2 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_d0 = (short)vSaturationCheckMax[0];
        sStack_ce = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_cc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_ca = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar37 = CONCAT26(-(ushort)(sStack_1a < sVar23),
                          CONCAT24(-(ushort)(sStack_1c < sVar23),
                                   CONCAT22(-(ushort)(sStack_1e < sVar23),
                                            -(ushort)(sStack_20 < sVar23)))) |
                 CONCAT26(-(ushort)(sVar24 < sStack_ca),
                          CONCAT24(-(ushort)(sVar24 < sStack_cc),
                                   CONCAT22(-(ushort)(sVar24 < sStack_ce),
                                            -(ushort)(sVar24 < sStack_d0))));
        auVar19._8_8_ = uVar37;
        auVar19._0_8_ =
             CONCAT26(-(ushort)(sStack_22 < sVar23),
                      CONCAT24(-(ushort)(sStack_24 < sVar23),
                               CONCAT22(-(ushort)(sStack_26 < sVar23),-(ushort)(local_28 < sVar23)))
                     ) |
             CONCAT26(-(ushort)(sVar24 < sStack_d2),
                      CONCAT24(-(ushort)(sVar24 < sStack_d4),
                               CONCAT22(-(ushort)(sVar24 < sStack_d6),-(ushort)(sVar24 < local_d8)))
                     );
        if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar37 >> 7 & 1) != 0) || (uVar37 >> 0xf & 1) != 0) || (uVar37 >> 0x17 & 1) != 0)
               || (uVar37 >> 0x1f & 1) != 0) || (uVar37 >> 0x27 & 1) != 0) ||
             (uVar37 >> 0x2f & 1) != 0) || (uVar37 >> 0x37 & 1) != 0) || (long)uVar37 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_5be = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_5be;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}